

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PythonDataType.h
# Opt level: O0

Ref<anurbs::BrepEdge> __thiscall
anurbs::PythonDataType<anurbs::Model,_anurbs::BrepEdge>::add
          (PythonDataType<anurbs::Model,_anurbs::BrepEdge> *this,Model *self,
          Pointer<anurbs::BrepEdge> *data)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::BrepEdge> RVar1;
  shared_ptr<anurbs::BrepEdge> local_30;
  Pointer<anurbs::BrepEdge> *local_20;
  Pointer<anurbs::BrepEdge> *data_local;
  Model *self_local;
  
  local_20 = data;
  data_local = (Pointer<anurbs::BrepEdge> *)self;
  self_local = (Model *)this;
  std::shared_ptr<anurbs::BrepEdge>::shared_ptr(&local_30,data);
  Model::add<anurbs::BrepEdge>((Model *)this,(Pointer<anurbs::BrepEdge> *)self);
  std::shared_ptr<anurbs::BrepEdge>::~shared_ptr(&local_30);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepEdge>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepEdge>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ref<TData> add(TModel& self, Pointer<TData> data)
    {
        return self.template add<TData>(data);
    }